

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O2

string * llvm::sys::getProcessTriple_abi_cxx11_(void)

{
  bool bVar1;
  size_t in_RCX;
  string *in_RDI;
  StringRef Str;
  Triple PT;
  string TargetTripleString;
  Triple TStack_e8;
  string local_b0;
  Twine local_90;
  Triple local_78;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"",(allocator *)&TStack_e8);
  updateTripleOSVersion(&local_b0,&local_40);
  std::__cxx11::string::_M_dispose();
  Str.Length = in_RCX;
  Str.Data = (char *)local_b0._M_string_length;
  Triple::normalize_abi_cxx11_(&local_78.Data,(Triple *)local_b0._M_dataplus._M_p,Str);
  Twine::Twine(&local_90,&local_78.Data);
  Triple::Triple(&TStack_e8,&local_90);
  std::__cxx11::string::_M_dispose();
  bVar1 = Triple::isArch32Bit(&TStack_e8);
  if (bVar1) {
    Triple::get64BitArchVariant(&local_78,&TStack_e8);
    Triple::operator=(&TStack_e8,&local_78);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)&TStack_e8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return in_RDI;
}

Assistant:

std::string sys::getProcessTriple() {
  std::string TargetTripleString = updateTripleOSVersion(LLVM_HOST_TRIPLE);
  Triple PT(Triple::normalize(TargetTripleString));

  if (sizeof(void *) == 8 && PT.isArch32Bit())
    PT = PT.get64BitArchVariant();
  if (sizeof(void *) == 4 && PT.isArch64Bit())
    PT = PT.get32BitArchVariant();

  return PT.str();
}